

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O3

void __thiscall GameTitle::moveInText(GameTitle *this,Screen *screen,int color)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined4 in_register_00000014;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->firstWord).screenLocation[0] = 0;
  refresh(this,screen,CONCAT44(in_register_00000014,color));
  iVar10 = -1;
  iVar2 = -1;
  if (_stdscr != 0) {
    iVar2 = *(short *)(_stdscr + 6) + 1;
  }
  screen->screenSize[1] = iVar2;
  iVar2 = screen->screenSize[1] - (int)(this->firstWord).text._M_string_length;
  (this->firstWord).screenLocation[1] = iVar2;
  (this->secondWord).screenLocation[0] = 0;
  (this->secondWord).screenLocation[1] = 0;
  refresh();
  if (_stdscr != 0) {
    iVar10 = *(short *)(_stdscr + 4) + 1;
  }
  screen->screenSize[0] = iVar10;
  iVar10 = screen->screenSize[0];
  (this->thirdWord).screenLocation[0] = iVar10;
  refresh();
  iVar11 = -1;
  iVar3 = -1;
  if (_stdscr != 0) {
    iVar3 = *(short *)(_stdscr + 6) + 1;
  }
  screen->screenSize[1] = iVar3;
  iVar3 = screen->screenSize[1] - (int)(this->thirdWord).text._M_string_length;
  (this->thirdWord).screenLocation[1] = iVar3;
  refresh();
  if (_stdscr != 0) {
    iVar11 = *(short *)(_stdscr + 4) + 1;
  }
  screen->screenSize[0] = iVar11;
  iVar11 = screen->screenSize[0];
  (this->fourthWord).screenLocation[0] = iVar11;
  (this->fourthWord).screenLocation[1] = 0;
  refresh();
  iVar12 = -1;
  iVar4 = -1;
  if (_stdscr != 0) {
    iVar4 = *(short *)(_stdscr + 4) + 1;
  }
  screen->screenSize[0] = iVar4;
  iVar4 = screen->screenSize[0];
  refresh();
  if (_stdscr != 0) {
    iVar12 = *(short *)(_stdscr + 6) + 1;
  }
  iVar4 = iVar4 / 2;
  screen->screenSize[1] = iVar12;
  iVar9 = screen->screenSize[1] / 2 - (int)(this->title)._M_string_length / 2;
  iVar12 = (int)(this->firstWord).text._M_string_length + iVar9;
  iVar7 = (int)(this->secondWord).text._M_string_length + iVar12;
  iVar5 = (int)(this->thirdWord).text._M_string_length + iVar7;
  iVar8 = 0x31;
  do {
    Screen::clearScreen(screen);
    pcVar1 = (this->firstWord).text._M_dataplus._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + (this->firstWord).text._M_string_length);
    Screen::printString(screen,&local_50,(this->firstWord).screenLocation[0],
                        (this->firstWord).screenLocation[1]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    pcVar1 = (this->secondWord).text._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar1,pcVar1 + (this->secondWord).text._M_string_length);
    Screen::printString(screen,&local_70,(this->secondWord).screenLocation[0],
                        (this->secondWord).screenLocation[1]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    pcVar1 = (this->thirdWord).text._M_dataplus._M_p;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,pcVar1,pcVar1 + (this->thirdWord).text._M_string_length);
    Screen::printString(screen,&local_90,(this->thirdWord).screenLocation[0],
                        (this->thirdWord).screenLocation[1]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    pcVar1 = (this->fourthWord).text._M_dataplus._M_p;
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar1,pcVar1 + (this->fourthWord).text._M_string_length);
    Screen::printString(screen,&local_b0,(this->fourthWord).screenLocation[0],
                        (this->fourthWord).screenLocation[1]);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    Screen::refreshScreen(screen);
    usleep(0xa2c2);
    iVar6 = iVar4 / 0x30;
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar6 = iVar6 + (this->firstWord).screenLocation[0];
    if (iVar4 <= iVar6) {
      iVar6 = iVar4;
    }
    (this->firstWord).screenLocation[0] = iVar6;
    iVar6 = (iVar9 - iVar2) / 0x30;
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar6 = (this->firstWord).screenLocation[1] - iVar6;
    if (iVar6 < iVar9) {
      iVar6 = iVar9;
    }
    (this->firstWord).screenLocation[1] = iVar6;
    iVar6 = iVar4 / 0x30;
    iVar13 = 1;
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar6 = iVar6 + (this->secondWord).screenLocation[0];
    if (iVar4 <= iVar6) {
      iVar6 = iVar4;
    }
    (this->secondWord).screenLocation[0] = iVar6;
    iVar6 = iVar12 / 0x30;
    if (iVar12 / 0x30 < 2) {
      iVar6 = iVar13;
    }
    iVar6 = iVar6 + (this->secondWord).screenLocation[1];
    if (iVar12 <= iVar6) {
      iVar6 = iVar12;
    }
    (this->secondWord).screenLocation[1] = iVar6;
    iVar6 = (iVar4 - iVar10) / 0x30;
    if (iVar6 < 2) {
      iVar6 = iVar13;
    }
    iVar6 = (this->thirdWord).screenLocation[0] - iVar6;
    if (iVar6 < iVar4) {
      iVar6 = iVar4;
    }
    (this->thirdWord).screenLocation[0] = iVar6;
    iVar6 = (iVar7 - iVar3) / 0x30;
    if (iVar6 < 2) {
      iVar6 = iVar13;
    }
    iVar6 = (this->thirdWord).screenLocation[1] - iVar6;
    if (iVar6 < iVar7) {
      iVar6 = iVar7;
    }
    (this->thirdWord).screenLocation[1] = iVar6;
    iVar6 = (iVar4 - iVar11) / 0x30;
    if (iVar6 < 2) {
      iVar6 = 1;
    }
    iVar6 = (this->fourthWord).screenLocation[0] - iVar6;
    if (iVar6 < iVar4) {
      iVar6 = iVar4;
    }
    (this->fourthWord).screenLocation[0] = iVar6;
    iVar6 = iVar5 / 0x30;
    if (iVar5 / 0x30 < 2) {
      iVar6 = 1;
    }
    iVar6 = iVar6 + (this->fourthWord).screenLocation[1];
    if (iVar5 <= iVar6) {
      iVar6 = iVar5;
    }
    (this->fourthWord).screenLocation[1] = iVar6;
    iVar8 = iVar8 + -1;
  } while (iVar8 != 0);
  return;
}

Assistant:

void GameTitle::moveInText(Screen &screen, int color) {
    int animationLength = 2;
    unsigned int frameCounter = 0;
    int totalAnimationFrames = animationLength * FRAMES_PER_SECOND;
    int firstWordStartLocation[2];
    int firstWordEndLocation[2];
    int secondWordStartLocation[2];
    int secondWordEndLocation[2];
    int thirdWordStartLocation[2];
    int thirdWordEndLocation[2];
    int fourthWordStartLocation[2];
    int fourthWordEndLocation[2];

    // Set the initial locations of the text
    firstWordStartLocation[0] = firstWord.screenLocation[0] = 0;
    firstWordStartLocation[1] = firstWord.screenLocation[1] = screen.getScreenSizeX() - static_cast<int>(firstWord.text.length());

    secondWordStartLocation[0] = secondWord.screenLocation[0] = 0;
    secondWordStartLocation[1] = secondWord.screenLocation[1] = 0;

    thirdWordStartLocation[0] = thirdWord.screenLocation[0] = screen.getScreenSizeY();
    thirdWordStartLocation[1] = thirdWord.screenLocation[1] = screen.getScreenSizeX() - static_cast<int>(thirdWord.text.length());

    fourthWordStartLocation[0] = fourthWord.screenLocation[0] = screen.getScreenSizeY();
    fourthWordStartLocation[1] = fourthWord.screenLocation[1] = 0;

    // Calculate the end positions of the text
    firstWordEndLocation[0] = secondWordEndLocation[0] = thirdWordEndLocation[0] = fourthWordEndLocation[0] = (screen.getScreenSizeY() / 2);

    firstWordEndLocation[1] = ( screen.getScreenSizeX() / 2 ) - ( static_cast<int>( title.length() ) / 2 );
    secondWordEndLocation[1] = firstWordEndLocation[1] + static_cast<int>( firstWord.text.length() );
    thirdWordEndLocation[1] = secondWordEndLocation[1] + static_cast<int>( secondWord.text.length() );
    fourthWordEndLocation[1] = thirdWordEndLocation[1] + static_cast<int>( thirdWord.text.length() );

    // Turn on the color attribute
    //screen.turnAttrOn(COLOR_PAIR(color));

    // Loop through the words until they are all in their respective end positions
    while(static_cast<int>(frameCounter) <= totalAnimationFrames){
        // Print the words on the screen
        screen.clearScreen();
        screen.printString(firstWord.text, firstWord.screenLocation[0], firstWord.screenLocation[1]);
        screen.printString(secondWord.text, secondWord.screenLocation[0], secondWord.screenLocation[1]);
        screen.printString(thirdWord.text, thirdWord.screenLocation[0], thirdWord.screenLocation[1]);
        screen.printString(fourthWord.text, fourthWord.screenLocation[0], fourthWord.screenLocation[1]);

        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND);

        // Move the words
        firstWord.screenLocation[0] = calculateNewPosition(firstWord.screenLocation[0],
                                                          animationLength,
                                                          firstWordStartLocation[0],
                                                          firstWordEndLocation[0],
                                                           DOWN);
        firstWord.screenLocation[1] = calculateNewPosition(firstWord.screenLocation[1],
                                                           animationLength,
                                                           firstWordStartLocation[1],
                                                           firstWordEndLocation[1],
                                                           LEFT);
        secondWord.screenLocation[0] = calculateNewPosition(secondWord.screenLocation[0],
                                                           animationLength,
                                                           secondWordStartLocation[0],
                                                           secondWordEndLocation[0],
                                                            DOWN);
        secondWord.screenLocation[1] = calculateNewPosition(secondWord.screenLocation[1],
                                                           animationLength,
                                                           secondWordStartLocation[1],
                                                           secondWordEndLocation[1],
                                                            RIGHT);
        thirdWord.screenLocation[0] = calculateNewPosition(thirdWord.screenLocation[0],
                                                           animationLength,
                                                           thirdWordStartLocation[0],
                                                           thirdWordEndLocation[0],
                                                            UP);
        thirdWord.screenLocation[1] = calculateNewPosition(thirdWord.screenLocation[1],
                                                           animationLength,
                                                           thirdWordStartLocation[1],
                                                           thirdWordEndLocation[1],
                                                           LEFT);
        fourthWord.screenLocation[0] = calculateNewPosition(fourthWord.screenLocation[0],
                                                           animationLength,
                                                           fourthWordStartLocation[0],
                                                           fourthWordEndLocation[0],
                                                            UP);
        fourthWord.screenLocation[1] = calculateNewPosition(fourthWord.screenLocation[1],
                                                           animationLength,
                                                           fourthWordStartLocation[1],
                                                           fourthWordEndLocation[1],
                                                            RIGHT);
        frameCounter++;
    }

    // Turn off the color attribute
    //screen.turnAttrOff(COLOR_PAIR(color));
}